

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read.cpp
# Opt level: O1

void testReadUnpack(string *tempdir)

{
  int iVar1;
  void *__s;
  void *__s_00;
  ostream *poVar2;
  char *__s_01;
  size_t sVar3;
  undefined8 extraout_RAX;
  long *in_RCX;
  char *unaff_R12;
  ostream *unaff_R15;
  exr_context_t f;
  string fn;
  exr_context_initializer_t cinit;
  exr_chunk_info_t cinfo;
  exr_decode_pipeline_t decoder;
  undefined8 local_2e0;
  long *local_2d8 [2];
  long local_2c8 [2];
  undefined8 local_2b8;
  code *pcStack_2b0;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  undefined8 local_298;
  undefined8 uStack_290;
  undefined8 local_288;
  undefined8 uStack_280;
  undefined8 local_278;
  undefined8 uStack_270;
  undefined8 local_268;
  undefined8 uStack_260;
  undefined8 local_258;
  undefined1 local_250 [64];
  long local_210 [60];
  
  local_2d8[0] = local_2c8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_2d8,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRCoreTest/../OpenEXRTest/"
             ,"");
  local_268 = 0;
  local_278 = 0;
  uStack_270 = 0;
  local_288 = 0;
  uStack_280 = 0;
  local_298 = 0;
  uStack_290 = 0;
  local_2a8 = 0;
  uStack_2a0 = 0;
  local_258 = 0;
  local_2b8 = 0x68;
  uStack_260 = 0xbf800000fffffffe;
  pcStack_2b0 = err_cb;
  std::__cxx11::string::append((char *)local_2d8);
  iVar1 = exr_start_read(&local_2e0,local_2d8[0],&local_2b8);
  if (iVar1 == 0) {
    in_RCX = (long *)0x2;
    iVar1 = exr_read_tile_chunk_info(local_2e0,0,4,2,0,0,local_250);
    if (iVar1 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Return Error: (",0xf);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      __s_01 = (char *)exr_get_default_error_message(iVar1);
      if (__s_01 != (char *)0x0) goto LAB_00146a14;
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      goto LAB_00146a2a;
    }
    in_RCX = local_210;
    iVar1 = exr_decoding_initialize(local_2e0,0,local_250);
    if (iVar1 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Return Error: (",0xf);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      __s_01 = (char *)exr_get_default_error_message(iVar1);
      if (__s_01 != (char *)0x0) goto LAB_00146a69;
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      goto LAB_00146a7f;
    }
    __s = operator_new__(0x480);
    __s_00 = operator_new__(0x240);
    memset(__s,0,0x480);
    memset(__s_00,0,0x240);
    *(void **)(local_210[0] + 0x28) = __s;
    *(undefined4 *)(local_210[0] + 0x24) = 0x30;
    *(undefined8 *)(local_210[0] + 0x1c) = 0x400020004;
    *(void **)(local_210[0] + 0x58) = __s_00;
    *(undefined4 *)(local_210[0] + 0x54) = 0x18;
    in_RCX = (long *)0x200010002;
    *(undefined8 *)(local_210[0] + 0x4c) = 0x200010002;
    iVar1 = exr_decoding_choose_default_routines(local_2e0,0);
    if (iVar1 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Return Error: (",0xf);
      unaff_R15 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
      std::__ostream_insert<char,std::char_traits<char>>(unaff_R15,") ",2);
      unaff_R12 = (char *)exr_get_default_error_message(iVar1);
      if (unaff_R12 != (char *)0x0) goto LAB_00146abe;
      std::ios::clear((int)unaff_R15 + (int)*(undefined8 *)(*(long *)unaff_R15 + -0x18));
      goto LAB_00146ad4;
    }
    iVar1 = exr_decoding_run(local_2e0,0,local_210);
    if (iVar1 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Return Error: (",0xf);
      unaff_R15 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
      std::__ostream_insert<char,std::char_traits<char>>(unaff_R15,") ",2);
      unaff_R12 = (char *)exr_get_default_error_message(iVar1);
      if (unaff_R12 != (char *)0x0) goto LAB_00146b13;
      std::ios::clear((int)unaff_R15 + (int)*(undefined8 *)(*(long *)unaff_R15 + -0x18));
      goto LAB_00146b29;
    }
    iVar1 = exr_decoding_destroy(local_2e0,local_210);
    if (iVar1 == 0) {
      operator_delete__(__s_00);
      operator_delete__(__s);
      exr_finish(&local_2e0);
      if (local_2d8[0] != local_2c8) {
        operator_delete(local_2d8[0],local_2c8[0] + 1);
      }
      return;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    unaff_R15 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
    std::__ostream_insert<char,std::char_traits<char>>(unaff_R15,") ",2);
    unaff_R12 = (char *)exr_get_default_error_message(iVar1);
    if (unaff_R12 == (char *)0x0) {
      std::ios::clear((int)unaff_R15 + (int)*(undefined8 *)(*(long *)unaff_R15 + -0x18));
      goto LAB_00146b7e;
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    __s_01 = (char *)exr_get_default_error_message(iVar1);
    if (__s_01 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(__s_01);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,__s_01,sVar3);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_start_read (&f, fn.c_str (), &cinit)",(char *)0x22d,0x1862b7,(char *)in_RCX)
    ;
LAB_00146a14:
    sVar3 = strlen(__s_01);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,__s_01,sVar3);
LAB_00146a2a:
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_read_tile_chunk_info (f, 0, 4, 2, 0, 0, &cinfo)",(char *)0x230,0x1862b7,
                   (char *)in_RCX);
LAB_00146a69:
    sVar3 = strlen(__s_01);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,__s_01,sVar3);
LAB_00146a7f:
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_decoding_initialize (f, 0, &cinfo, &decoder)",(char *)0x234,0x1862b7,
                   (char *)in_RCX);
LAB_00146abe:
    sVar3 = strlen(unaff_R12);
    std::__ostream_insert<char,std::char_traits<char>>(unaff_R15,unaff_R12,sVar3);
LAB_00146ad4:
    std::ios::widen((char)*(undefined8 *)(*(long *)unaff_R15 + -0x18) + (char)unaff_R15);
    std::ostream::put((char)unaff_R15);
    std::ostream::flush();
    core_test_fail("exr_decoding_choose_default_routines (f, 0, &decoder)",(char *)0x246,0x1862b7,
                   (char *)in_RCX);
LAB_00146b13:
    sVar3 = strlen(unaff_R12);
    std::__ostream_insert<char,std::char_traits<char>>(unaff_R15,unaff_R12,sVar3);
LAB_00146b29:
    std::ios::widen((char)*(undefined8 *)(*(long *)unaff_R15 + -0x18) + (char)unaff_R15);
    std::ostream::put((char)unaff_R15);
    std::ostream::flush();
    core_test_fail("exr_decoding_run (f, 0, &decoder)",(char *)0x248,0x1862b7,(char *)in_RCX);
  }
  sVar3 = strlen(unaff_R12);
  std::__ostream_insert<char,std::char_traits<char>>(unaff_R15,unaff_R12,sVar3);
LAB_00146b7e:
  std::ios::widen((char)*(undefined8 *)(*(long *)unaff_R15 + -0x18) + (char)unaff_R15);
  std::ostream::put((char)unaff_R15);
  std::ostream::flush();
  core_test_fail("exr_decoding_destroy (f, &decoder)",(char *)0x24c,0x1862b7,(char *)in_RCX);
  if (local_2d8[0] != local_2c8) {
    operator_delete(local_2d8[0],local_2c8[0] + 1);
  }
  _Unwind_Resume(extraout_RAX);
}

Assistant:

void
testOpenTiles (const std::string& tempdir)
{
    exr_context_t             f;
    std::string               fn    = ILM_IMF_TEST_IMAGEDIR;
    exr_context_initializer_t cinit = EXR_DEFAULT_CONTEXT_INITIALIZER;
    cinit.error_handler_fn          = &err_cb;

    fn += "tiled.exr";
    EXRCORE_TEST_RVAL (exr_start_read (&f, fn.c_str (), &cinit));
    exr_finish (&f);

    fn = ILM_IMF_TEST_IMAGEDIR;
    fn += "v1.7.test.tiled.exr";
    EXRCORE_TEST_RVAL (exr_start_read (&f, fn.c_str (), &cinit));
    exr_finish (&f);
}